

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void libcellml::clearComponentImports(ComponentPtr *component)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  ImportedEntity local_30;
  
  bVar1 = ImportedEntity::isImport
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ImportedEntity);
  if (bVar1) {
    ImportedEntity::importSource(&local_30);
    ImportSource::removeModel((ImportSource *)local_30._vptr_ImportedEntity);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30.mPimpl);
  }
  uVar3 = 0;
  while( true ) {
    sVar2 = ComponentEntity::componentCount
                      (&((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ComponentEntity);
    if (sVar2 <= uVar3) break;
    ComponentEntity::component
              ((ComponentEntity *)&local_30,
               (size_t)(component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    clearComponentImports((ComponentPtr *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30.mPimpl);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void clearComponentImports(const ComponentPtr &component)
{
    if (component->isImport()) {
        component->importSource()->removeModel();
    }
    for (size_t c = 0; c < component->componentCount(); ++c) {
        clearComponentImports(component->component(c));
    }
}